

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StegerMatch.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  allocator<char> local_389;
  _Vector_base<int,_std::allocator<int>_> local_388;
  _InputArray local_368;
  undefined1 local_350 [16];
  uchar *local_340;
  StegerMatch local_1f0;
  Mat myInput;
  Mat myTemplate;
  Mat myOutput;
  Mat saving_image;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Hello Steger2002 matcher!");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_350,"C:/Users/hisham/stegerMatch/template.jpg",
             (allocator<char> *)&myInput);
  cv::imread((string *)&myTemplate,(int)local_350);
  std::__cxx11::string::~string((string *)local_350);
  myInput.flags = 300;
  myInput.dims = 0x96;
  myInput.rows = 0x15e;
  myInput.cols = 200;
  cv::Mat::Mat((Mat *)local_350,&myTemplate,(Rect_ *)&myInput);
  cv::Mat::operator=(&myTemplate,(Mat *)local_350);
  cv::Mat::~Mat((Mat *)local_350);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_350,"C:/Users/hisham/stegerMatch/input.jpg",
             (allocator<char> *)&myOutput);
  cv::imread((string *)&myInput,(int)local_350);
  std::__cxx11::string::~string((string *)local_350);
  local_1f0.mTemplateLoaded = false;
  local_1f0.mParameters.mMinRotation = 0.0;
  local_1f0.mParameters.mMaxRotation = 360.0;
  local_1f0.mParameters.mNumRotationSteps = 10.0;
  local_1f0.mParameters.mMinScale = 0.1;
  local_1f0.mParameters.mMaxScale = 2.0;
  local_1f0.mParameters.mNumScaleSteps = 10.0;
  local_1f0.mTemplateSet.
  super__Vector_base<StegerMatch::mTemplateStruct,_std::allocator<StegerMatch::mTemplateStruct>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f0.mTemplateSet.
  super__Vector_base<StegerMatch::mTemplateStruct,_std::allocator<StegerMatch::mTemplateStruct>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1f0.mTemplateSet.
  super__Vector_base<StegerMatch::mTemplateStruct,_std::allocator<StegerMatch::mTemplateStruct>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  StegerMatch::loadTemplate(&local_1f0,&myTemplate);
  if (local_1f0.mTemplateLoaded == true) {
    cv::Mat::Mat(&myOutput);
    StegerMatch::processFrame(&local_1f0,&myInput,&myOutput);
    cv::operator*((Mat *)local_350,256.0);
    cv::MatExpr::operator_cast_to_Mat(&saving_image,(MatExpr *)local_350);
    cv::MatExpr::~MatExpr((MatExpr *)local_350);
    local_340 = (uchar *)0x0;
    local_350._0_4_ = 0x2010000;
    local_350._8_8_ = &saving_image;
    cv::Mat::convertTo((_OutputArray *)&saving_image,(int)local_350,1.0,0.0);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_350,"output.jpg",&local_389);
    local_368.sz.width = 0;
    local_368.sz.height = 0;
    local_368.flags = 0x1010000;
    local_388._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_388._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_388._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_368.obj = &saving_image;
    cv::imwrite((string *)local_350,&local_368,(vector *)&local_388);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_388);
    std::__cxx11::string::~string((string *)local_350);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_350,"template",(allocator<char> *)&local_388);
    local_368.sz.width = 0;
    local_368.sz.height = 0;
    local_368.flags = 0x1010000;
    local_368.obj = &myTemplate;
    cv::imshow((string *)local_350,&local_368);
    std::__cxx11::string::~string((string *)local_350);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_350,"input",(allocator<char> *)&local_388);
    local_368.sz.width = 0;
    local_368.sz.height = 0;
    local_368.flags = 0x1010000;
    local_368.obj = &myInput;
    cv::imshow((string *)local_350,&local_368);
    std::__cxx11::string::~string((string *)local_350);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_350,"output",(allocator<char> *)&local_388);
    local_368.sz.width = 0;
    local_368.sz.height = 0;
    local_368.flags = 0x1010000;
    local_368.obj = &myOutput;
    cv::imshow((string *)local_350,&local_368);
    std::__cxx11::string::~string((string *)local_350);
    cv::waitKey(0);
    cv::Mat::~Mat(&saving_image);
    cv::Mat::~Mat(&myOutput);
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cerr,"Template was not loaded.");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  std::vector<StegerMatch::mTemplateStruct,_std::allocator<StegerMatch::mTemplateStruct>_>::~vector
            (&local_1f0.mTemplateSet);
  cv::Mat::~Mat(&myInput);
  cv::Mat::~Mat(&myTemplate);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
    cout << "Hello Steger2002 matcher!" << endl;
    
    Mat myTemplate = imread("C:/Users/hisham/stegerMatch/template.jpg");
    //create ROI on the template image to only include the object... fill in the right values
	myTemplate = myTemplate(Rect(Point(300, 150), Size(350, 200)));
    
    Mat myInput = imread("C:/Users/hisham/stegerMatch/input.jpg");
	//Mat myInput = imread("C:/Users/hisham/stegerMatch/template2.jpg");
    


    StegerMatch match;	
    match.loadTemplate(myTemplate);
	
    if (match.isTemplateLoaded()) {
        Mat myOutput;
        match.processFrame(myInput, myOutput);
        
		Mat saving_image=myOutput*256;
		saving_image.convertTo(saving_image, CV_8UC1);
		imwrite("output.jpg", saving_image);


        imshow("template",  myTemplate);
        imshow("input",     myInput);
        imshow("output",    myOutput);
        waitKey(0);
    } else {
        cerr << "Template was not loaded." << endl;
    }
	
	
    
    return 0;
}